

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOS65XXDisassembler.c
# Opt level: O1

void MOS65XX_printInst(MCInst *MI,SStream *O,void *PrinterInfo)

{
  uint uVar1;
  int64_t iVar2;
  char *fmt;
  
  uVar1 = MI->Opcode;
  SStream_concat0(O,InstructionInfoTable[OpInfoTable[uVar1].ins].name);
  if (OpInfoTable[(ulong)uVar1 & 0xff].am - MOS65XX_AM_ACC < 0xc) {
    iVar2 = MI->Operands[0].field_2.ImmVal;
    switch(OpInfoTable[(ulong)uVar1 & 0xff].am) {
    case MOS65XX_AM_ACC:
      SStream_concat(O," a",iVar2);
      return;
    case MOS65XX_AM_ABS:
      fmt = " $0x%04x";
      break;
    case MOS65XX_AM_ZP:
      fmt = " $0x%02x";
      break;
    case MOS65XX_AM_IMM:
      fmt = " #$0x%02x";
      break;
    case MOS65XX_AM_ABSX:
      fmt = " $0x%04x, x";
      break;
    case MOS65XX_AM_ABSY:
      fmt = " $0x%04x, y";
      break;
    case MOS65XX_AM_INDX:
      fmt = " ($0x%02x, x)";
      break;
    case MOS65XX_AM_INDY:
      fmt = " ($0x%02x), y";
      break;
    case MOS65XX_AM_ZPX:
      fmt = " $0x%02x, x";
      break;
    case MOS65XX_AM_ZPY:
      fmt = " $0x%02x, y";
      break;
    case MOS65XX_AM_REL:
      SStream_concat(O," $0x%04x",(long)(char)iVar2 + MI->address + 2);
      return;
    case MOS65XX_AM_IND:
      fmt = " ($0x%04x)";
    }
    SStream_concat(O,fmt,iVar2);
    return;
  }
  return;
}

Assistant:

void MOS65XX_printInst(MCInst *MI, struct SStream *O, void *PrinterInfo)
{
#ifndef CAPSTONE_DIET
	unsigned char opcode = MI->Opcode;

	SStream_concat0(O, InstructionInfoTable[OpInfoTable[MI->Opcode].ins].name);
	unsigned int value = MI->Operands[0].ImmVal;

	switch (OpInfoTable[opcode].am) {
		default:
			break;

		case MOS65XX_AM_IMP:
			break;

		case MOS65XX_AM_ACC:
			SStream_concat(O, " a");
			break;

		case MOS65XX_AM_ABS:
			SStream_concat(O, " $0x%04x", value);
			break;

		case MOS65XX_AM_IMM:
			SStream_concat(O, " #$0x%02x", value);
			break;

		case MOS65XX_AM_ZP:
			SStream_concat(O, " $0x%02x", value);
			break;

		case MOS65XX_AM_ABSX:
			SStream_concat(O, " $0x%04x, x", value);
			break;

		case MOS65XX_AM_ABSY:
			SStream_concat(O, " $0x%04x, y", value);
			break;

		case MOS65XX_AM_ZPX:
			SStream_concat(O, " $0x%02x, x", value);
			break;

		case MOS65XX_AM_ZPY:
			SStream_concat(O, " $0x%02x, y", value);
			break;

		case MOS65XX_AM_REL:
			SStream_concat(O, " $0x%04x", MI->address + (signed char) value + 2);
			break;

		case MOS65XX_AM_IND:
			SStream_concat(O, " ($0x%04x)", value);
			break;

		case MOS65XX_AM_INDX:
			SStream_concat(O, " ($0x%02x, x)", value);
			break;

		case MOS65XX_AM_INDY:
			SStream_concat(O, " ($0x%02x), y", value);
			break;
	}
#endif
}